

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

SmallVectorImpl<char> * __thiscall
llvm::SmallVectorImpl<char>::operator=(SmallVectorImpl<char> *this,SmallVectorImpl<char> *RHS)

{
  uint uVar1;
  uint uVar2;
  size_t __n;
  ptrdiff_t _Num_1;
  ulong __n_00;
  ptrdiff_t _Num;
  ulong __n_01;
  
  if (this != RHS) {
    uVar1 = (RHS->super_SmallVectorTemplateBase<char,_true>).
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    __n_01 = (ulong)uVar1;
    uVar2 = (this->super_SmallVectorTemplateBase<char,_true>).
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    __n_00 = (ulong)uVar2;
    if (uVar2 < uVar1) {
      if ((this->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar1) {
        __n_00 = 0;
        SmallVectorBase::set_size((SmallVectorBase *)this,0);
        SmallVectorTemplateBase<char,_true>::grow
                  (&this->super_SmallVectorTemplateBase<char,_true>,__n_01);
      }
      else if (__n_00 == 0) {
        __n_00 = 0;
      }
      else {
        memmove((this->super_SmallVectorTemplateBase<char,_true>).
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                (RHS->super_SmallVectorTemplateBase<char,_true>).
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,__n_00);
      }
      __n = (RHS->super_SmallVectorTemplateBase<char,_true>).
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size - __n_00;
      if (__n != 0) {
        memcpy((void *)(__n_00 + (long)(this->super_SmallVectorTemplateBase<char,_true>).
                                       super_SmallVectorTemplateCommon<char,_void>.
                                       super_SmallVectorBase.BeginX),
               (void *)((long)(RHS->super_SmallVectorTemplateBase<char,_true>).
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                              BeginX + __n_00),__n);
      }
    }
    else if (__n_01 != 0) {
      memmove((this->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
              (RHS->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,__n_01);
    }
    SmallVectorBase::set_size((SmallVectorBase *)this,__n_01);
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->set_size(RHSSize);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->set_size(0);
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->set_size(RHSSize);
  return *this;
}